

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_FormatDateTime
              (RecyclableObject *function,CallInfo callInfo,...)

{
  Type *this;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  int iVar6;
  charcount_t cVar7;
  charcount_t cVar8;
  undefined4 *puVar9;
  Var pvVar10;
  DynamicObject *state;
  JavascriptBoolean *pJVar11;
  JavascriptLibrary *pJVar12;
  void **resource;
  undefined8 uVar13;
  char *pcVar14;
  char *pcVar15;
  undefined4 extraout_var;
  undefined8 uVar16;
  LPCSTR pCVar17;
  Recycler *pRVar18;
  char16 *pcVar19;
  Recycler *pRVar20;
  JavascriptArray *arr;
  JavascriptString *pJVar21;
  JavascriptString *pJVar22;
  char16_t *pcVar23;
  char *error;
  char16_t *form;
  int arrIndex;
  uint uVar24;
  size_t sVar25;
  double value;
  double dVar26;
  uint in_stack_00000010;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 uVar27;
  undefined1 local_138 [8];
  int partStart;
  size_t local_128;
  char *local_120;
  DWORD local_118;
  FinalizableICUObject<void_**,_&udat_close_70> *local_98;
  Var cachedUDateFormat;
  DynamicObject *local_88;
  JavascriptLibrary *local_80;
  undefined4 *local_78;
  undefined1 local_70 [8];
  Arguments args;
  FinalizableICUObject<void_**,_&udat_close_70> *local_48;
  ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70> local_40;
  ScopedUFieldPositionIterator fpi;
  UErrorCode status;
  int partEnd;
  
  uVar27 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x9e9,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b63bf5;
    *puVar9 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  local_70 = (undefined1  [8])callInfo;
  if ((callInfo._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x9e9,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00b63bf5;
    *puVar9 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_70 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x9e9,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00b63bf5;
    *puVar9 = 0;
  }
  if ((local_70._0_4_ & 0xffffff) == 5) {
    pvVar10 = Arguments::operator[]((Arguments *)local_70,1);
    bVar3 = DynamicObject::IsBaseDynamicObject(pvVar10);
    if (!bVar3) goto LAB_00b62a67;
    pvVar10 = Arguments::operator[]((Arguments *)local_70,2);
    if (((ulong)pvVar10 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00b63bf5;
      *puVar9 = 0;
    }
    if ((((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000) &&
       (pvVar10 = Arguments::operator[]((Arguments *)local_70,2), (ulong)pvVar10 >> 0x32 == 0))
    goto LAB_00b62a67;
    pvVar10 = Arguments::operator[]((Arguments *)local_70,3);
    bVar3 = VarIs<Js::JavascriptBoolean>(pvVar10);
    if (!bVar3) goto LAB_00b62a67;
    pvVar10 = Arguments::operator[]((Arguments *)local_70,4);
    bVar3 = VarIs<Js::JavascriptBoolean>(pvVar10);
    if (!bVar3) goto LAB_00b62a67;
  }
  else {
LAB_00b62a67:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xa2b,
                                "((args.Info.Count == 5 && DynamicObject::IsBaseDynamicObject(args[1]) && (TaggedInt::Is(args[2]) || JavascriptNumber::Is(args[2])) && VarIs<JavascriptBoolean>(args[3]) && VarIs<JavascriptBoolean>(args[4])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar3) goto LAB_00b63bf5;
    *puVar9 = 0;
  }
  pvVar10 = Arguments::operator[]((Arguments *)local_70,1);
  state = UnsafeVarTo<Js::DynamicObject>(pvVar10);
  pvVar10 = Arguments::operator[]((Arguments *)local_70,3);
  pJVar11 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar10);
  iVar6 = pJVar11->value;
  pvVar10 = Arguments::operator[]((Arguments *)local_70,2);
  value = JavascriptDate::TimeClip(pvVar10);
  bVar3 = NumberUtilities::IsNan(value);
  if (bVar3) {
    JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ebfc,(PCWSTR)0x0);
  }
  pvVar10 = Arguments::operator[]((Arguments *)local_70,4);
  pJVar11 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar10);
  pcVar23 = L"%S(): Calling DateTimeFormat.prototype.formatToParts(new Date(%f))\n";
  if (iVar6 == 0) {
    pcVar23 = L"%S(): Calling DateTimeFormat.prototype.format(new Date(%f))\n";
  }
  form = L"%S(): Calling new Date(%f).toLocaleString(...)\n";
  if (pJVar11->value == 0) {
    form = pcVar23;
  }
  Output::Trace(IntlPhase,form,value,"EntryIntl_FormatDateTime");
  local_98 = (FinalizableICUObject<void_**,_&udat_close_70> *)0x0;
  fpi.object._0_4_ = 0;
  iVar4 = (*(state->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x14])(state,state,0xb,&local_98,0,pSVar1);
  if (iVar4 == 0) {
    local_78 = (undefined4 *)CONCAT44(local_78._4_4_,iVar6);
    pJVar12 = (JavascriptLibrary *)AssertStringProperty(state,(PropertyIds)0x20d);
    pJVar21 = AssertStringProperty(state,(PropertyIds)0x274);
    local_88 = state;
    pJVar22 = AssertStringProperty(state,(PropertyIds)0x272);
    memset((char (*) [157])local_138,0,0x9d);
    local_80 = pJVar12;
    LangtagToLocaleID<157ul>((JavascriptString *)pJVar12,(char (*) [157])local_138);
    pRVar20 = pSVar1->recycler;
    iVar6 = (*(pJVar21->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x65])(pJVar21);
    args.Values = (Type)pJVar21;
    cVar7 = JavascriptString::GetLength(pJVar21);
    iVar4 = (*(pJVar22->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x65])(pJVar22);
    cachedUDateFormat = pJVar22;
    cVar8 = JavascriptString::GetLength(pJVar22);
    resource = (void **)udat_open_70(0xfffffffe,0xfffffffe,local_138,iVar6,cVar7,iVar4,
                                     CONCAT44(uVar27,cVar8),&fpi);
    local_48 = FinalizableICUObject<void_**,_&udat_close_70>::New(pRVar20,resource);
    if ((int)fpi.object == 7) goto LAB_00b63c06;
    if (0 < (int)fpi.object || (int)fpi.object == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      pCVar17 = (LPCSTR)u_errorName_70((int)fpi.object);
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xa66,"(false)",pCVar17);
      if (!bVar3) goto LAB_00b63bf5;
      *puVar9 = 0;
    }
    uVar13 = udat_getCalendar_70(local_48->resource);
    pcVar14 = (char *)ucal_getType_70(uVar13,&fpi);
    if ((int)fpi.object == 7) goto LAB_00b63c06;
    if ((int)fpi.object < 1 && (int)fpi.object != -0x7c) {
      if (pcVar14 == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        error = "(calType != nullptr)";
        pcVar15 = "calType != nullptr";
        goto LAB_00b62de3;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      pcVar15 = (char *)u_errorName_70((int)fpi.object);
      error = "(false)";
LAB_00b62de3:
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xa6d,error,pcVar15);
      if (!bVar3) goto LAB_00b63bf5;
      *puVar9 = 0;
    }
    iVar6 = strcmp(pcVar14,"gregorian");
    if (iVar6 == 0) {
      ucal_setGregorianChange_70(0xc33eb208c2dc0000,uVar13,&fpi);
      dVar26 = (double)ucal_getGregorianChange_70(uVar13,&fpi);
      if ((int)fpi.object == 7) {
LAB_00b63c06:
        Throw::OutOfMemory();
      }
      if ((int)fpi.object < 1 && (int)fpi.object != -0x7c) {
        if ((dVar26 == -8.64e+15) && (!NAN(dVar26))) goto LAB_00b62ef3;
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        pcVar15 = "(beginningOfTime == actualGregorianChange)";
        pcVar14 = "beginningOfTime == actualGregorianChange";
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        pcVar14 = (char *)u_errorName_70((int)fpi.object);
        pcVar15 = "(false)";
      }
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xa73,pcVar15,pcVar14);
      if (!bVar3) goto LAB_00b63bf5;
      *puVar9 = 0;
    }
LAB_00b62ef3:
    iVar6 = (*(local_80->super_JavascriptLibraryBase).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
    uVar13 = (**(code **)(*cachedUDateFormat + 0x328))();
    uVar16 = (**(code **)((long)*args.Values + 0x328))();
    Output::Trace(IntlPhase,
                  L"%S(): Caching new UDateFormat (0x%x) with langtag=%s, pattern=%s, timezone=%s\n"
                  ,"EntryIntl_FormatDateTime",local_48,CONCAT44(extraout_var,iVar6),uVar13,uVar16);
    (*(local_88->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x19])(local_88,0xb,local_48,0,0);
    iVar6 = (int)local_78;
  }
  else {
    local_48 = local_98;
    Output::Trace(IntlPhase,L"%S(): Using previously cached UDateFormat (0x%x)\n",
                  "EntryIntl_FormatDateTime");
  }
  if (iVar6 == 0) {
    pRVar20 = pSVar1->recycler;
    local_40.object = (UFieldPositionIterator *)((ulong)local_40.object._4_4_ << 0x20);
    local_138 = (undefined1  [8])&char16_t::typeinfo;
    _partStart = 0;
    local_128 = 8;
    local_120 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
    ;
    local_118 = 0x159;
    pRVar18 = Memory::Recycler::TrackAllocInfo(pRVar20,(TrackAllocData *)local_138);
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00b63bf5;
      *puVar9 = 0;
    }
    pcVar19 = (char16 *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                        (pRVar18,0x10);
    if (pcVar19 == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00b63bf5;
      *puVar9 = 0;
    }
    cVar7 = udat_format_70(value,local_48->resource,pcVar19,8,0,&local_40);
    if ((int)cVar7 < 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15b,
                                  "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)"
                                  ,"allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0"
                                 );
      if (!bVar3) goto LAB_00b63bf5;
      *puVar9 = 0;
    }
    if (((int)local_40.object == 0xf) || ((int)local_40.object == -0x7c)) {
      if ((int)cVar7 < 8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x15e,"(*returnLength >= firstTryLength)",
                                    "Executor reported buffer failure but did not require additional space"
                                   );
        if (!bVar3) goto LAB_00b63bf5;
        *puVar9 = 0;
      }
      uVar24 = cVar7 + 1;
      Output::Trace(IntlPhase,
                    L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                    "EnsureBuffer",8,(ulong)uVar24);
      local_40.object = local_40.object & 0xffffffff00000000;
      local_138 = (undefined1  [8])&char16_t::typeinfo;
      _partStart = 0;
      local_120 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
      ;
      local_118 = 0x162;
      local_128 = (long)(int)uVar24;
      pRVar20 = Memory::Recycler::TrackAllocInfo(pRVar20,(TrackAllocData *)local_138);
      if (cVar7 == 0xffffffff) {
        Memory::Recycler::ClearTrackAllocInfo(pRVar20,(TrackAllocData *)0x0);
        pcVar19 = (char16 *)&DAT_00000008;
      }
      else {
        sVar25 = 0xffffffffffffffff;
        if (-1 < (int)uVar24) {
          sVar25 = (long)(int)uVar24 * 2;
        }
        BVar5 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                      "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar3) goto LAB_00b63bf5;
          *puVar9 = 0;
        }
        pcVar19 = (char16 *)
                  Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                            (pRVar20,sVar25);
        if (pcVar19 == (char16 *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar3) goto LAB_00b63bf5;
          *puVar9 = 0;
        }
      }
      cVar8 = udat_format_70(value,local_48->resource,pcVar19,uVar24,0,&local_40);
      bVar3 = cVar8 != cVar7;
      cVar7 = cVar8;
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x164,"(*returnLength == secondTryLength - 1)",
                                    "Second try of executor returned unexpected length");
        goto joined_r0x00b637d5;
      }
    }
    else if (7 < (int)cVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x168,"(*returnLength < firstTryLength)",
                                  "Executor required additional length but reported successful status"
                                 );
joined_r0x00b637d5:
      if (!bVar3) goto LAB_00b63bf5;
      *puVar9 = 0;
    }
    if ((int)local_40.object < 1 && (int)local_40.object != -0x7c) {
LAB_00b63bcf:
      pJVar21 = JavascriptString::NewWithBuffer(pcVar19,cVar7,pSVar1);
      return pJVar21;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    pCVar17 = (LPCSTR)u_errorName_70((ulong)local_40.object & 0xffffffff);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar17);
    if (bVar3) {
      *puVar9 = 0;
      goto LAB_00b63bcf;
    }
    goto LAB_00b63bf5;
  }
  local_40.object = (UFieldPositionIterator *)ufieldpositer_open_70(&fpi);
  if ((int)fpi.object == 7) {
    Throw::OutOfMemory();
  }
  if (0 < (int)fpi.object || (int)fpi.object == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    pCVar17 = (LPCSTR)u_errorName_70((int)fpi.object);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xa92,"(false)",pCVar17);
    if (!bVar3) goto LAB_00b63bf5;
    *puVar9 = 0;
  }
  pRVar20 = pSVar1->recycler;
  fpi.object._4_4_ = 0;
  local_138 = (undefined1  [8])&char16_t::typeinfo;
  _partStart = 0;
  local_128 = 8;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
  ;
  local_118 = 0x159;
  pRVar18 = Memory::Recycler::TrackAllocInfo(pRVar20,(TrackAllocData *)local_138);
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_00b63bf5;
    *puVar9 = 0;
  }
  pcVar19 = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (pRVar18,0x10);
  if (pcVar19 == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) goto LAB_00b63bf5;
    *puVar9 = 0;
  }
  iVar6 = udat_formatForFields_70
                    (value,local_48->resource,pcVar19,8,local_40.object,
                     (undefined1 *)((long)&fpi.object + 4));
  if (iVar6 < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x15b,
                                "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)",
                                "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0");
    if (!bVar3) goto LAB_00b63bf5;
    *puVar9 = 0;
  }
  if ((fpi.object._4_4_ == 0xf) || (fpi.object._4_4_ == -0x7c)) {
    if (iVar6 < 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15e,"(*returnLength >= firstTryLength)",
                                  "Executor reported buffer failure but did not require additional space"
                                 );
      if (!bVar3) goto LAB_00b63bf5;
      *puVar9 = 0;
    }
    uVar24 = iVar6 + 1;
    Output::Trace(IntlPhase,
                  L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                  "EnsureBuffer",8,(ulong)uVar24);
    fpi.object._4_4_ = 0;
    local_138 = (undefined1  [8])&char16_t::typeinfo;
    _partStart = 0;
    local_120 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
    ;
    local_118 = 0x162;
    local_128 = (long)(int)uVar24;
    pRVar20 = Memory::Recycler::TrackAllocInfo(pRVar20,(TrackAllocData *)local_138);
    if (uVar24 == 0) {
      pcVar19 = (char16 *)&DAT_00000008;
      Memory::Recycler::ClearTrackAllocInfo(pRVar20,(TrackAllocData *)0x0);
    }
    else {
      sVar25 = 0xffffffffffffffff;
      if (-1 < (int)uVar24) {
        sVar25 = (long)(int)uVar24 * 2;
      }
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00b63bf5;
        *puVar9 = 0;
      }
      pcVar19 = (char16 *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                          (pRVar20,sVar25);
      if (pcVar19 == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00b63bf5;
        *puVar9 = 0;
      }
    }
    iVar4 = udat_formatForFields_70
                      (value,local_48->resource,pcVar19,uVar24,local_40.object,
                       (undefined1 *)((long)&fpi.object + 4));
    args.Values = (Type)CONCAT44(args.Values._4_4_,iVar4);
    if (iVar4 != iVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x164,"(*returnLength == secondTryLength - 1)",
                                  "Second try of executor returned unexpected length");
      if (!bVar3) goto LAB_00b63bf5;
      goto LAB_00b63832;
    }
  }
  else if (iVar6 < 8) {
    args.Values = (Type)CONCAT44(args.Values._4_4_,iVar6);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x168,"(*returnLength < firstTryLength)",
                                "Executor required additional length but reported successful status"
                               );
    if (!bVar3) goto LAB_00b63bf5;
    args.Values = (Type)CONCAT44(args.Values._4_4_,iVar6);
LAB_00b63832:
    *puVar9 = 0;
  }
  if (0 < fpi.object._4_4_ || fpi.object._4_4_ == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    pCVar17 = (LPCSTR)u_errorName_70(fpi.object._4_4_);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar17);
    if (!bVar3) goto LAB_00b63bf5;
    *puVar9 = 0;
  }
  pJVar12 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  arr = JavascriptLibrary::CreateArray(pJVar12,0);
  local_138 = (undefined1  [8])((ulong)local_138 & 0xffffffff00000000);
  fpi.object._4_4_ = 0;
  iVar6 = ufieldpositer_next_70(local_40.object);
  local_80 = pJVar12;
  if (iVar6 < 0) {
    iVar4 = 0;
    arrIndex = 0;
  }
  else {
    local_78 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    this = &pJVar12->stringCache;
    arrIndex = 0;
    iVar4 = 0;
    do {
      if ((fpi.object._4_4_ <= (int)local_138._0_4_) || ((int)args.Values < fpi.object._4_4_)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *local_78 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0xaa5,"(partStart < partEnd && partEnd <= formattedLen)",
                                    "partStart < partEnd && partEnd <= formattedLen");
        if (!bVar3) goto LAB_00b63bf5;
        *local_78 = 0;
      }
      switch(iVar6) {
      case 0:
        pJVar21 = StringCache::GetIntlEraPart(this);
        break;
      case 1:
      case 0x14:
      case 0x1e:
        pJVar21 = StringCache::GetIntlYearPart(this);
        break;
      case 2:
      case 0x1a:
        pJVar21 = StringCache::GetIntlMonthPart(this);
        break;
      case 3:
        pJVar21 = StringCache::GetIntlDayPart(this);
        break;
      case 4:
      case 5:
      case 0xf:
      case 0x10:
        pJVar21 = StringCache::GetIntlHourPart(this);
        break;
      case 6:
        pJVar21 = StringCache::GetIntlMinutePart(this);
        break;
      case 7:
        pJVar21 = StringCache::GetIntlSecondPart(this);
        break;
      default:
        pJVar21 = StringCache::GetIntlUnknownPart(this);
        break;
      case 9:
      case 0x13:
      case 0x19:
        pJVar21 = StringCache::GetIntlWeekdayPart(this);
        break;
      case 0xe:
        pJVar21 = StringCache::GetIntlDayPeriodPart(this);
        break;
      case 0x11:
      case 0x17:
      case 0x18:
      case 0x1d:
      case 0x1f:
      case 0x20:
      case 0x21:
        pJVar21 = StringCache::GetIntlTimeZoneNamePart(this);
      }
      uVar27 = local_138._0_4_;
      if (iVar4 < (int)local_138._0_4_) {
        pJVar22 = StringCache::GetIntlLiteralPart(this);
        AddPartToPartsArray(pSVar1,arr,arrIndex,pcVar19,iVar4,uVar27,pJVar22);
        arrIndex = arrIndex + 1;
      }
      AddPartToPartsArray(pSVar1,arr,arrIndex,pcVar19,local_138._0_4_,fpi.object._4_4_,pJVar21);
      iVar4 = fpi.object._4_4_;
      iVar6 = ufieldpositer_next_70(local_40.object,local_138,(undefined1 *)((long)&fpi.object + 4))
      ;
      arrIndex = arrIndex + 1;
    } while (-1 < iVar6);
  }
  if (iVar4 != (int)args.Values) {
    if ((int)args.Values <= iVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xae6,"(lastPartEnd < formattedLen)","lastPartEnd < formattedLen"
                                 );
      if (!bVar3) {
LAB_00b63bf5:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
    pJVar21 = StringCache::GetIntlLiteralPart(&local_80->stringCache);
    AddPartToPartsArray(pSVar1,arr,arrIndex,pcVar19,iVar4,(int)args.Values,pJVar21);
  }
  PlatformAgnostic::ICUHelpers::ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70>::
  ~ScopedICUObject(&local_40);
  return arr;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_FormatDateTime(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#ifdef INTL_WINGLOB
        if (args.Info.Count < 3 || !(TaggedInt::Is(args.Values[1]) || JavascriptNumber::Is(args.Values[1])) || !DynamicObject::IsBaseDynamicObject(args.Values[2]))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        Windows::Foundation::DateTime winDate;
        HRESULT hr;
        if (TaggedInt::Is(args.Values[1]))
        {
            hr = Js::DateUtilities::ES5DateToWinRTDate(TaggedInt::ToInt32(args.Values[1]), &(winDate.UniversalTime));
        }
        else
        {
            hr = Js::DateUtilities::ES5DateToWinRTDate(JavascriptNumber::GetValue(args.Values[1]), &(winDate.UniversalTime));
        }
        if (FAILED(hr))
        {
            HandleOOMSOEHR(hr);
            // If conversion failed, double value is outside the range of WinRT DateTime
            Js::JavascriptError::ThrowRangeError(scriptContext, JSERR_OutOfDateTimeRange);
        }

        DynamicObject* obj = VarTo<DynamicObject>(args.Values[2]);
        Var hiddenObject = nullptr;
        AssertOrFailFastMsg(obj->GetInternalProperty(obj, Js::InternalPropertyIds::HiddenObject, &hiddenObject, NULL, scriptContext),
            "EntryIntl_FormatDateTime: Could not retrieve hiddenObject.");

        //We are going to perform the same check for timeZone as when caching the formatter.
        Var propertyValue = nullptr;
        AutoHSTRING result;

        //If timeZone is undefined; then use the standard dateTimeFormatter to format in local time; otherwise use the IDateTimeFormatter2 to format using specified timezone (UTC)
        if (!GetPropertyBuiltInFrom(obj, __timeZone) || JavascriptOperators::IsUndefinedObject(propertyValue))
        {
            DateTimeFormatting::IDateTimeFormatter *formatter = static_cast<DateTimeFormatting::IDateTimeFormatter *>(((AutoCOMJSObject *)hiddenObject)->GetInstance());
            Assert(formatter);
            IfFailThrowHr(formatter->Format(winDate, &result));
        }
        else
        {
            DateTimeFormatting::IDateTimeFormatter2 *formatter = static_cast<DateTimeFormatting::IDateTimeFormatter2 *>(((AutoCOMJSObject *)hiddenObject)->GetInstance());
            Assert(formatter);
            HSTRING timeZone;
            HSTRING_HEADER timeZoneHeader;

            // IsValidTimeZone() has already verified that this is JavascriptString.
            JavascriptString* userDefinedTimeZoneId = VarTo<JavascriptString>(propertyValue);
            IfFailThrowHr(WindowsCreateStringReference(userDefinedTimeZoneId->GetSz(), userDefinedTimeZoneId->GetLength(), &timeZoneHeader, &timeZone));
            Assert(timeZone);

            IfFailThrowHr(formatter->FormatUsingTimeZone(winDate, timeZone, &result));
        }
        PCWSTR strBuf = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary()->WindowsGetStringRawBuffer(*result, NULL);

        return Js::JavascriptString::NewCopySz(strBuf, scriptContext);
#else
        // This function vaguely implements ECMA 402 #sec-partitiondatetimepattern
        INTL_CHECK_ARGS(
            args.Info.Count == 5 &&
            DynamicObject::IsBaseDynamicObject(args[1]) &&
            (TaggedInt::Is(args[2]) || JavascriptNumber::Is(args[2])) &&
            VarIs<JavascriptBoolean>(args[3]) &&
            VarIs<JavascriptBoolean>(args[4])
        );

        DynamicObject *state = UnsafeVarTo<DynamicObject>(args[1]);
        bool toParts = Js::UnsafeVarTo<Js::JavascriptBoolean>(args[3])->GetValue();

        // 1. Let x be TimeClip(x)
        // 2. If x is NaN, throw a RangeError exception
        double date = JavascriptDate::TimeClip(args[2]);
        if (JavascriptNumber::IsNan(date))
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_InvalidDate);
        }

        bool forDatePrototypeToLocaleString = UnsafeVarTo<JavascriptBoolean>(args[4])->GetValue();
        if (forDatePrototypeToLocaleString)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Date_Prototype_toLocaleString);
            INTL_TRACE("Calling new Date(%f).toLocaleString(...)", date);
        }
        else if (toParts)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(DateTimeFormat_Prototype_formatToParts);
            INTL_TRACE("Calling DateTimeFormat.prototype.formatToParts(new Date(%f))", date);
        }
        else
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(DateTimeFormat_Prototype_format);
            INTL_TRACE("Calling DateTimeFormat.prototype.format(new Date(%f))", date);
        }

        // Below, we lazy-initialize the backing UDateFormat on the first call to format{ToParts}
        // On subsequent calls, the UDateFormat will be cached in state.CachedUDateFormat
        Var cachedUDateFormat = nullptr;
        FinalizableUDateFormat *dtf = nullptr;
        UErrorCode status = U_ZERO_ERROR;
        if (state->GetInternalProperty(state, InternalPropertyIds::CachedUDateFormat, &cachedUDateFormat, nullptr, scriptContext))
        {
            dtf = reinterpret_cast<FinalizableUDateFormat *>(cachedUDateFormat);
            INTL_TRACE("Using previously cached UDateFormat (0x%x)", dtf);
        }
        else
        {
            JavascriptString *langtag = AssertStringProperty(state, PropertyIds::locale);
            JavascriptString *timeZone = AssertStringProperty(state, PropertyIds::timeZone);
            JavascriptString *pattern = AssertStringProperty(state, PropertyIds::pattern);

            char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
            LangtagToLocaleID(langtag, localeID);

            dtf = FinalizableUDateFormat::New(scriptContext->GetRecycler(), udat_open(
                UDAT_PATTERN,
                UDAT_PATTERN,
                localeID,
                reinterpret_cast<const UChar *>(timeZone->GetSz()),
                timeZone->GetLength(),
                reinterpret_cast<const UChar *>(pattern->GetSz()),
                pattern->GetLength(),
                &status
            ));
            ICU_ASSERT(status, true);

            // DateTimeFormat is expected to use the "proleptic Gregorian calendar", which means that the Julian calendar should never be used.
            // To accomplish this, we can set the switchover date between julian/gregorian
            // to the ECMAScript beginning of time, which is -8.64e15 according to ecma262 #sec-time-values-and-time-range
            UCalendar *cal = const_cast<UCalendar *>(udat_getCalendar(*dtf));
            const char *calType = ucal_getType(cal, &status);
            ICU_ASSERT(status, calType != nullptr);
            if (strcmp(calType, "gregorian") == 0)
            {
                double beginningOfTime = -8.64e15;
                ucal_setGregorianChange(cal, beginningOfTime, &status);
                double actualGregorianChange = ucal_getGregorianChange(cal, &status);
                ICU_ASSERT(status, beginningOfTime == actualGregorianChange);
            }

            INTL_TRACE("Caching new UDateFormat (0x%x) with langtag=%s, pattern=%s, timezone=%s", dtf, langtag->GetSz(), pattern->GetSz(), timeZone->GetSz());

            // cache dtf for later use (so that the condition that brought us here returns true for future calls)
            state->SetInternalProperty(
                InternalPropertyIds::CachedUDateFormat,
                dtf,
                PropertyOperationFlags::PropertyOperation_None,
                nullptr
            );
        }

        // We intentionally special-case the following two calls to EnsureBuffer to allow zero-length strings.
        // See comment in GetPatternForSkeleton.

        char16 *formatted = nullptr;
        int formattedLen = 0;
        if (!toParts)
        {
            // if we aren't formatting to parts, we simply want to call udat_format with retry
            EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
            {
                return udat_format(*dtf, date, buf, bufLen, nullptr, status);
            }, scriptContext->GetRecycler(), &formatted, &formattedLen, /* allowZeroLengthStrings */ true);
            return JavascriptString::NewWithBuffer(formatted, formattedLen, scriptContext);
        }

        // The rest of this function most closely corresponds to ECMA 402 #sec-partitiondatetimepattern
        ScopedUFieldPositionIterator fpi(ufieldpositer_open(&status));
        ICU_ASSERT(status, true);
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return udat_formatForFields(*dtf, date, buf, bufLen, fpi, status);
        }, scriptContext->GetRecycler(), &formatted, &formattedLen, /* allowZeroLengthStrings */ true);

        JavascriptLibrary *library = scriptContext->GetLibrary();
        JavascriptArray* ret = library->CreateArray(0);

        int partStart = 0;
        int partEnd = 0;
        int lastPartEnd = 0;
        int i = 0;
        for (
            int kind = ufieldpositer_next(fpi, &partStart, &partEnd);
            kind >= 0;
            kind = ufieldpositer_next(fpi, &partStart, &partEnd), ++i
        )
        {
            Assert(partStart < partEnd && partEnd <= formattedLen);
            JavascriptString *typeString = nullptr;
            UDateFormatField fieldKind = (UDateFormatField)kind;
            switch (fieldKind)
            {
            case UDAT_ERA_FIELD:
                typeString = library->GetIntlEraPartString(); break;
            case UDAT_YEAR_FIELD:
            case UDAT_EXTENDED_YEAR_FIELD:
            case UDAT_YEAR_NAME_FIELD:
                typeString = library->GetIntlYearPartString(); break;
            case UDAT_MONTH_FIELD:
            case UDAT_STANDALONE_MONTH_FIELD:
                typeString = library->GetIntlMonthPartString(); break;
            case UDAT_DATE_FIELD:
                typeString = library->GetIntlDayPartString(); break;
            case UDAT_HOUR_OF_DAY1_FIELD:
            case UDAT_HOUR_OF_DAY0_FIELD:
            case UDAT_HOUR1_FIELD:
            case UDAT_HOUR0_FIELD:
                typeString = library->GetIntlHourPartString(); break;
            case UDAT_MINUTE_FIELD:
                typeString = library->GetIntlMinutePartString(); break;
            case UDAT_SECOND_FIELD:
                typeString = library->GetIntlSecondPartString(); break;
            case UDAT_DAY_OF_WEEK_FIELD:
            case UDAT_STANDALONE_DAY_FIELD:
            case UDAT_DOW_LOCAL_FIELD:
                typeString = library->GetIntlWeekdayPartString(); break;
            case UDAT_AM_PM_FIELD:
                typeString = library->GetIntlDayPeriodPartString(); break;
            case UDAT_TIMEZONE_FIELD:
            case UDAT_TIMEZONE_RFC_FIELD:
            case UDAT_TIMEZONE_GENERIC_FIELD:
            case UDAT_TIMEZONE_SPECIAL_FIELD:
            case UDAT_TIMEZONE_LOCALIZED_GMT_OFFSET_FIELD:
            case UDAT_TIMEZONE_ISO_FIELD:
            case UDAT_TIMEZONE_ISO_LOCAL_FIELD:
                typeString = library->GetIntlTimeZoneNamePartString(); break;
#if defined(ICU_VERSION) && ICU_VERSION == 55
            case UDAT_TIME_SEPARATOR_FIELD:
                // ICU 55 (Ubuntu 16.04 system default) has the ":" in "5:23 PM" as a special field
                // Intl should just treat this as a literal
                typeString = library->GetIntlLiteralPartString(); break;
#endif
            default:
                typeString = library->GetIntlUnknownPartString(); break;
            }

            if (partStart > lastPartEnd)
            {
                // formatForFields does not report literal fields directly, so we have to detect them
                // by seeing if the current part starts after the previous one ended
                AddPartToPartsArray(scriptContext, ret, i, formatted, lastPartEnd, partStart, library->GetIntlLiteralPartString());
                i += 1;
            }

            AddPartToPartsArray(scriptContext, ret, i, formatted, partStart, partEnd, typeString);
            lastPartEnd = partEnd;
        }

        // Sometimes, there can be a literal at the end of the string, such as when formatting just the year in
        // the chinese calendar, where the pattern string will be `r(U)`. The trailing `)` will be a literal
        if (lastPartEnd != formattedLen)
        {
            AssertOrFailFast(lastPartEnd < formattedLen);

            // `i` was incremented by the consequence of the last iteration of the for loop
            AddPartToPartsArray(scriptContext, ret, i, formatted, lastPartEnd, formattedLen, library->GetIntlLiteralPartString());
        }

        return ret;
#endif
    }